

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_named_interface_blocks.cpp
# Opt level: O0

glsl_type * process_array_type(glsl_type *type,uint idx)

{
  bool bVar1;
  glsl_type *pgVar2;
  glsl_type *new_array_type;
  glsl_type *element_type;
  uint idx_local;
  glsl_type *type_local;
  
  pgVar2 = (type->fields).array;
  bVar1 = glsl_type::is_array(pgVar2);
  if (bVar1) {
    pgVar2 = process_array_type(pgVar2,idx);
    type_local = glsl_type::get_array_instance(pgVar2,type->length,0);
  }
  else {
    type_local = glsl_type::get_array_instance
                           (*(glsl_type **)((pgVar2->fields).array + idx),type->length,0);
  }
  return type_local;
}

Assistant:

static const glsl_type *
process_array_type(const glsl_type *type, unsigned idx)
{
   const glsl_type *element_type = type->fields.array;
   if (element_type->is_array()) {
      const glsl_type *new_array_type = process_array_type(element_type, idx);
      return glsl_type::get_array_instance(new_array_type, type->length);
   } else {
      return glsl_type::get_array_instance(
         element_type->fields.structure[idx].type, type->length);
   }
}